

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall
QtMWidgets::DateTimePickerPrivate::fillValues(DateTimePickerPrivate *this,bool updateIndexes)

{
  QVector<Section> *this_00;
  reference pSVar1;
  int i;
  long i_00;
  long lVar2;
  
  this_00 = &(this->super_DateTimeParser).sections;
  lVar2 = 0x28;
  for (i_00 = 0; i_00 < (this->super_DateTimeParser).sections.d.size; i_00 = i_00 + 1) {
    pSVar1 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
    Section::fillValues(pSVar1,&this->value,&this->minimum,&this->maximum,updateIndexes);
    if (*(int *)((long)&((this->super_DateTimeParser).sections.d.ptr)->type + lVar2) == -1) {
      pSVar1 = QList<QtMWidgets::Section>::operator[](this_00,i_00);
      pSVar1->currentIndex = 0;
    }
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void
DateTimePickerPrivate::fillValues( bool updateIndexes )
{
	for( int i = 0; i < sections.size(); ++i )
	{
		sections[ i ].fillValues( value, minimum, maximum,
			updateIndexes );

		if( sections.at( i ).currentIndex == -1 )
			sections[ i ].currentIndex = 0;
	}
}